

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O3

void __thiscall
mp::NLW2_NLFeeder_C_Impl::FeedRowAndObjNames<mp::StringFileWriter>
          (NLW2_NLFeeder_C_Impl *this,StringFileWriter *wrt)

{
  bool bVar1;
  StringFileWriter *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  if ((this->nlf2_c_).want_row_and_obj_names_ != 0) {
    if (wrt->fTriedOpen_ == false) {
      bVar1 = StringFileWriter::Open(wrt);
      if (!bVar1) {
        return;
      }
    }
    else if ((wrt->nm).f_ == (FILE *)0x0) {
      return;
    }
    local_28 = 0;
    local_18 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:399:13)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/include/api/c/nl-feeder-c-impl.h:399:13)>
               ::_M_manager;
    local_30 = wrt;
    (*(this->nlf2_c_).FeedRowAndObjNames)((this->nlf2_c_).p_user_data_,&local_30);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,3);
    }
  }
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    assert(NLF().FeedRowAndObjNames);
    if (NLF().want_row_and_obj_names_ && wrt) {
      std::function<void(const char*)> wrt_c
          = [&wrt](const char* name) {
        wrt << name;
      };
      NLF().FeedRowAndObjNames(NLF().p_user_data_, &wrt_c);
    }
  }